

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

CURLsslset Curl_init_sslset_nolock(curl_sslbackend id,char *name,curl_ssl_backend ***avail)

{
  int iVar1;
  CURLsslset CVar2;
  Curl_ssl *backend;
  Curl_ssl **ppCVar3;
  
  if (avail != (curl_ssl_backend ***)0x0) {
    *avail = (curl_ssl_backend **)available_backends;
  }
  if (Curl_ssl == &Curl_ssl_multi) {
    CVar2 = CURLSSLSET_UNKNOWN_BACKEND;
    for (ppCVar3 = available_backends; backend = *ppCVar3, backend != (Curl_ssl *)0x0;
        ppCVar3 = ppCVar3 + 1) {
      if ((backend->info).id == id) {
LAB_004dbe8e:
        multissl_setup(backend);
        return CURLSSLSET_OK;
      }
      if ((name != (char *)0x0) &&
         (iVar1 = Curl_strcasecompare((backend->info).name,name), iVar1 != 0)) {
        backend = *ppCVar3;
        goto LAB_004dbe8e;
      }
    }
  }
  else {
    CVar2 = CURLSSLSET_OK;
    if ((Curl_ssl->info).id != id) {
      if (name == (char *)0x0) {
        CVar2 = CURLSSLSET_UNKNOWN_BACKEND;
      }
      else {
        iVar1 = Curl_strcasecompare(name,(Curl_ssl->info).name);
        CVar2 = (CURLsslset)(iVar1 == 0);
      }
    }
  }
  return CVar2;
}

Assistant:

CURLsslset Curl_init_sslset_nolock(curl_sslbackend id, const char *name,
                                   const curl_ssl_backend ***avail)
{
  int i;

  if(avail)
    *avail = (const curl_ssl_backend **)&available_backends;

  if(Curl_ssl != &Curl_ssl_multi)
    return id == Curl_ssl->info.id ||
           (name && strcasecompare(name, Curl_ssl->info.name)) ?
           CURLSSLSET_OK :
#if defined(CURL_WITH_MULTI_SSL)
           CURLSSLSET_TOO_LATE;
#else
           CURLSSLSET_UNKNOWN_BACKEND;
#endif

  for(i = 0; available_backends[i]; i++) {
    if(available_backends[i]->info.id == id ||
       (name && strcasecompare(available_backends[i]->info.name, name))) {
      multissl_setup(available_backends[i]);
      return CURLSSLSET_OK;
    }
  }

  return CURLSSLSET_UNKNOWN_BACKEND;
}